

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O2

dropt_char * dropt_strndup(dropt_char *s,size_t n)

{
  size_t __n;
  dropt_char *__dest;
  
  if (s == (dropt_char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0xcb,"dropt_char *dropt_strndup(const dropt_char *, size_t)");
  }
  for (__n = 0; n != __n; __n = __n + 1) {
    if (s[__n] == '\0') goto LAB_00103805;
  }
  __n = n;
  if (n != 0xffffffffffffffff) {
LAB_00103805:
    __dest = (dropt_char *)dropt_safe_malloc(__n + 1,1);
    if (__dest != (dropt_char *)0x0) {
      memcpy(__dest,s,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (dropt_char *)0x0;
}

Assistant:

dropt_char*
dropt_strndup(const dropt_char* s, size_t n)
{
    dropt_char* copy;
    size_t len = 0;

    assert(s != NULL);

    while (len < n && s[len] != DROPT_TEXT_LITERAL('\0'))
    {
        len++;
    }

    if (len + 1 < len)
    {
        /* This overflow check shouldn't be strictly necessary. `len` can be at
         * most `SIZE_MAX`, so `SIZE_MAX + 1` can wrap around to 0, but
         * `dropt_safe_malloc` will return `NULL` for a 0-sized allocation.
         * However, favor defensive paranoia.
         */
        return NULL;
    }

    copy = dropt_safe_malloc(len + 1 /* NUL */, sizeof *copy);
    if (copy != NULL)
    {
        memcpy(copy, s, len * sizeof *copy);
        copy[len] = DROPT_TEXT_LITERAL('\0');
    }

    return copy;
}